

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::ScrollbarEx(ImRect *bb_frame,ImGuiID id,ImGuiAxis axis,float *p_scroll_v,
                       float size_avail_v,float size_contents_v,ImDrawCornerFlags rounding_corners)

{
  ImGuiWindow *pIVar1;
  ImDrawList *this;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [12];
  ImGuiContext *pIVar5;
  ImVec2 *p_max;
  bool bVar6;
  ImU32 IVar7;
  undefined7 extraout_var;
  ImRect *pIVar8;
  ImGuiCol idx;
  uint uVar9;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  undefined4 in_XMM1_Db;
  float fVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  float fVar21;
  undefined1 auVar17 [12];
  int iVar20;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar22;
  float fVar23;
  bool held;
  bool hovered;
  bool local_ee;
  bool local_ed;
  float local_ec;
  ImRect local_e8;
  undefined8 local_d8;
  ImDrawCornerFlags local_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  ulong local_88;
  undefined8 uStack_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  ulong local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar5 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if (pIVar1->SkipItems == false) {
    fVar22 = (bb_frame->Max).x - (bb_frame->Min).x;
    fVar23 = (bb_frame->Max).y - (bb_frame->Min).y;
    local_ee = false;
    if ((0.0 < fVar22) && (0.0 < fVar23)) {
      local_ec = 1.0;
      if (axis == ImGuiAxis_Y) {
        fVar10 = (GImGui->Style).FramePadding.y;
        fVar10 = fVar10 + fVar10;
        if (fVar23 < fVar10 + GImGui->FontSize) {
          fVar10 = (fVar23 - GImGui->FontSize) / fVar10;
          if (fVar10 < 0.0) {
            return (bool)'\0';
          }
          local_ec = 1.0;
          if (fVar10 <= 1.0) {
            local_ec = fVar10;
          }
          if (local_ec <= 0.0) {
            return (bool)'\0';
          }
        }
      }
      iVar16 = (int)((fVar22 + -2.0) * 0.5);
      iVar20 = (int)((fVar23 + -2.0) * 0.5);
      auVar14._0_4_ = -(uint)(iVar16 < 0);
      auVar14._4_4_ = -(uint)(iVar20 < 0);
      auVar14._8_8_ = 0;
      auVar18._0_4_ = -(uint)(3 < iVar16);
      auVar18._4_4_ = -(uint)(3 < iVar20);
      auVar18._8_8_ = 0;
      auVar15._0_8_ = CONCAT44((float)iVar20,(float)iVar16) ^ 0x8000000080000000;
      auVar15._8_4_ = 0x80000000;
      auVar15._12_4_ = 0x80000000;
      auVar15 = auVar14 & _DAT_00660590 | ~auVar14 & (auVar18 & _DAT_00660580 | ~auVar18 & auVar15);
      fStack_a0 = auVar15._0_4_;
      fVar22 = auVar15._4_4_;
      auVar12._0_8_ = auVar15._0_8_;
      auVar12._8_4_ = fStack_a0;
      auVar12._12_4_ = fVar22;
      local_e8.Min.x = (bb_frame->Min).x;
      local_e8.Min.y = (bb_frame->Min).y;
      local_e8.Max.x = (bb_frame->Max).x;
      local_e8.Max.y = (bb_frame->Max).y;
      local_a8 = local_e8.Min.x - fStack_a0;
      fVar23 = local_e8.Min.y - fVar22;
      fStack_a0 = local_e8.Max.x + fStack_a0;
      fStack_a4 = local_e8.Max.y + fVar22;
      auVar4._4_8_ = auVar12._8_8_;
      auVar4._0_4_ = local_e8.Min.y + fVar22;
      auVar13._0_8_ = auVar4._0_8_ << 0x20;
      auVar13._8_4_ = fStack_a0;
      auVar13._12_4_ = fStack_a4;
      local_e8.Max = auVar13._8_8_;
      local_e8.Min.y = fVar23;
      local_e8.Min.x = local_a8;
      if (axis != ImGuiAxis_X) {
        fStack_a0 = fStack_a4;
        local_a8 = fVar23;
      }
      local_a8 = fStack_a0 - local_a8;
      fVar22 = (float)(~-(uint)(size_avail_v <= size_contents_v) & (uint)size_avail_v |
                      -(uint)(size_avail_v <= size_contents_v) & (uint)size_contents_v);
      local_b8 = CONCAT44(in_XMM1_Db,size_contents_v);
      local_bc = rounding_corners;
      if (fVar22 <= 0.0) {
        __assert_fail("ImMax(size_contents_v, size_avail_v) > 0.0f",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_widgets.cpp"
                      ,0x332,
                      "bool ImGui::ScrollbarEx(const ImRect &, ImGuiID, ImGuiAxis, float *, float, float, ImDrawCornerFlags)"
                     );
      }
      if (fVar22 <= 1.0) {
        fVar22 = 1.0;
      }
      fVar10 = (size_avail_v / fVar22) * local_a8;
      fVar22 = (GImGui->Style).GrabMinSize;
      fVar23 = local_a8;
      if (fVar10 <= local_a8) {
        fVar23 = fVar10;
      }
      uVar9 = -(uint)(fVar10 < fVar22);
      uStack_94 = ~in_XMM0_Db & (uint)fStack_a4;
      uStack_90 = ~in_XMM0_Dc & (uint)fStack_a0;
      uStack_8c = ~in_XMM0_Dd & (uint)fStack_a4;
      local_98 = (float)(uVar9 & (uint)fVar22 | ~uVar9 & (uint)fVar23);
      local_ee = false;
      local_ed = false;
      local_d8 = (ImVec2 *)CONCAT44(in_XMM0_Db,size_avail_v);
      fStack_9c = fStack_a4;
      bVar6 = ButtonBehavior(&local_e8,id,&local_ed,&local_ee,0x2000);
      fVar22 = 1.0;
      fVar23 = fVar22;
      if (1.0 <= (float)local_b8 - (float)local_d8) {
        fVar23 = (float)local_b8 - (float)local_d8;
      }
      auVar19._4_4_ = *p_scroll_v;
      auVar19._0_4_ = local_98;
      auVar19._8_4_ = uStack_94;
      auVar19._12_4_ = 0;
      auVar2._4_4_ = fVar23;
      auVar2._0_4_ = local_a8;
      auVar2._8_4_ = fStack_a4;
      auVar2._12_4_ = 0;
      auVar15 = divps(auVar19,auVar2);
      fVar21 = auVar15._4_4_;
      iVar16 = -(uint)(auVar15._0_4_ < 1.0);
      auVar3._4_4_ = iVar16;
      auVar3._0_4_ = iVar16;
      auVar3._8_4_ = -(uint)(fVar21 < 0.0);
      auVar3._12_4_ = -(uint)(fVar21 < 0.0);
      uVar9 = movmskpd((int)CONCAT71(extraout_var,bVar6),auVar3);
      fVar10 = 0.0;
      if (((uVar9 & 2) == 0) && (fVar10 = fVar22, fVar21 <= 1.0)) {
        fVar10 = fVar21;
      }
      local_d8 = &bb_frame->Max;
      local_b8 = (ulong)(uint)((fVar10 * (local_a8 - local_98)) / local_a8);
      uStack_b0 = 0;
      if (((1.0 <= local_ec) && ((uVar9 & 1) != 0)) && (local_ee != false)) {
        fStack_74 = fStack_a4;
        fStack_70 = fStack_a0;
        fStack_6c = fStack_9c;
        local_68 = (ulong)(uint)fVar23;
        uStack_60 = 0;
        pIVar8 = (ImRect *)&local_e8.Min.y;
        if (axis == ImGuiAxis_X) {
          pIVar8 = &local_e8;
        }
        fVar23 = (*(float *)((pIVar5->IO).MouseDown + (ulong)(axis != ImGuiAxis_X) * 4 + -8) -
                 (pIVar8->Min).x) / local_a8;
        if (fVar23 <= 1.0) {
          fVar22 = fVar23;
        }
        local_88 = (ulong)(~-(uint)(fVar23 < 0.0) & (uint)fVar22);
        uStack_80 = 0;
        local_78 = local_a8 - local_98;
        local_58 = auVar15;
        SetHoveredID(id);
        if (pIVar5->ActiveIdIsJustActivated == false) {
          fVar22 = pIVar5->ScrollbarClickDeltaToGrabCenter;
          bVar6 = false;
        }
        else if (((float)local_88 < (float)local_b8) ||
                ((float)local_58._0_4_ + (float)local_b8 < (float)local_88)) {
          pIVar5->ScrollbarClickDeltaToGrabCenter = 0.0;
          bVar6 = true;
          fVar22 = 0.0;
        }
        else {
          fVar22 = (float)local_58._0_4_ * -0.5 + ((float)local_88 - (float)local_b8);
          pIVar5->ScrollbarClickDeltaToGrabCenter = fVar22;
          bVar6 = false;
        }
        auVar17 = ZEXT812(0x3f800000);
        fVar22 = (((float)local_88 - fVar22) - (float)local_58._0_4_ * 0.5) /
                 (1.0 - (float)local_58._0_4_);
        auVar11 = ZEXT812(0x3f800000);
        if (fVar22 <= 1.0) {
          auVar11._4_8_ = auVar11._4_8_;
          auVar11._0_4_ = fVar22;
        }
        fVar22 = (float)(int)((float)(~-(uint)(fVar22 < 0.0) & auVar11._0_4_) * (float)local_68 +
                             0.5);
        *p_scroll_v = fVar22;
        fVar22 = fVar22 / (float)local_68;
        if (fVar22 <= auVar17._0_4_) {
          auVar17._4_8_ = auVar17._4_8_;
          auVar17._0_4_ = fVar22;
        }
        fVar22 = (local_78 * (float)(~-(uint)(fVar22 < 0.0) & auVar17._0_4_)) / local_a8;
        local_b8 = CONCAT44(fStack_74,fVar22);
        uStack_b0 = CONCAT44(fStack_6c,fStack_70);
        if (bVar6) {
          pIVar5->ScrollbarClickDeltaToGrabCenter =
               -(float)local_58._0_4_ * 0.5 + ((float)local_88 - fVar22);
        }
      }
      p_max = local_d8;
      this = pIVar1->DrawList;
      IVar7 = GetColorU32(0xe,1.0);
      ImDrawList::AddRectFilled(this,&bb_frame->Min,p_max,IVar7,pIVar1->WindowRounding,local_bc);
      idx = 0x11;
      if (local_ee == false) {
        idx = (local_ed & 1) + 0xf;
      }
      IVar7 = GetColorU32(idx,local_ec);
      if (axis == ImGuiAxis_X) {
        local_40.x = local_e8.Min.x + (local_e8.Max.x - local_e8.Min.x) * (float)local_b8;
        local_38.x = local_98 + local_40.x;
        local_40.y = local_e8.Min.y;
        local_38.y = local_e8.Max.y;
      }
      else {
        local_40.y = (local_e8.Max.y - local_e8.Min.y) * (float)local_b8 + local_e8.Min.y;
        local_40.x = local_e8.Min.x;
        local_38.x = local_e8.Max.x;
        local_38.y = local_98 + local_40.y;
      }
      ImDrawList::AddRectFilled
                (pIVar1->DrawList,&local_40,&local_38,IVar7,(pIVar5->Style).ScrollbarRounding,0xf);
    }
  }
  else {
    local_ee = false;
  }
  return local_ee;
}

Assistant:

bool ImGui::ScrollbarEx(const ImRect& bb_frame, ImGuiID id, ImGuiAxis axis, float* p_scroll_v, float size_avail_v, float size_contents_v, ImDrawCornerFlags rounding_corners)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const float bb_frame_width = bb_frame.GetWidth();
    const float bb_frame_height = bb_frame.GetHeight();
    if (bb_frame_width <= 0.0f || bb_frame_height <= 0.0f)
        return false;

    // When we are too small, start hiding and disabling the grab (this reduce visual noise on very small window and facilitate using the resize grab)
    float alpha = 1.0f;
    if ((axis == ImGuiAxis_Y) && bb_frame_height < g.FontSize + g.Style.FramePadding.y * 2.0f)
        alpha = ImSaturate((bb_frame_height - g.FontSize) / (g.Style.FramePadding.y * 2.0f));
    if (alpha <= 0.0f)
        return false;

    const ImGuiStyle& style = g.Style;
    const bool allow_interaction = (alpha >= 1.0f);
    const bool horizontal = (axis == ImGuiAxis_X);

    ImRect bb = bb_frame;
    bb.Expand(ImVec2(-ImClamp((float)(int)((bb_frame_width - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp((float)(int)((bb_frame_height - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    const float scrollbar_size_v = horizontal ? bb.GetWidth() : bb.GetHeight();

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(size_contents_v, size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const float win_size_v = ImMax(ImMax(size_contents_v, size_avail_v), 1.0f);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * (size_avail_v / win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    float scroll_max = ImMax(1.0f, size_contents_v - size_avail_v);
    float scroll_ratio = ImSaturate(*p_scroll_v / scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;
    if (held && allow_interaction && grab_h_norm < 1.0f)
    {
        float scrollbar_pos_v = horizontal ? bb.Min.x : bb.Min.y;
        float mouse_pos_v = horizontal ? g.IO.MousePos.x : g.IO.MousePos.y;

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (g.ActiveIdIsJustActivated)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            seek_absolute = (clicked_v_norm < grab_v_norm || clicked_v_norm > grab_v_norm + grab_h_norm);
            if (seek_absolute)
                g.ScrollbarClickDeltaToGrabCenter = 0.0f;
            else
                g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
        }

        // Apply scroll
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of ContentSize and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - g.ScrollbarClickDeltaToGrabCenter - grab_h_norm * 0.5f) / (1.0f - grab_h_norm));
        *p_scroll_v = (float)(int)(0.5f + scroll_v_norm * scroll_max);//(win_size_contents_v - win_size_v));

        // Update values for rendering
        scroll_ratio = ImSaturate(*p_scroll_v / scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
    }

    // Render
    window->DrawList->AddRectFilled(bb_frame.Min, bb_frame.Max, GetColorU32(ImGuiCol_ScrollbarBg), window->WindowRounding, rounding_corners);
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab, alpha);
    ImRect grab_rect;
    if (horizontal)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels);
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);

    return held;
}